

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O1

void step_to_eos(lgx_lex_t *ctx,char end)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  iVar1 = (ctx->source).length;
  iVar3 = ctx->offset;
  if (iVar3 < iVar1) {
    pcVar2 = (ctx->source).content;
    do {
      if (pcVar2[iVar3] == '\\') {
        iVar3 = iVar3 + 1;
        ctx->offset = iVar3;
      }
      else if ((iVar3 < iVar1) && ((ctx->source).content[iVar3] == end)) {
        ctx->offset = iVar3 + 1;
        return;
      }
      iVar3 = iVar3 + 1;
      ctx->offset = iVar3;
    } while (iVar3 < iVar1);
  }
  return;
}

Assistant:

static void step_to_eos(lgx_lex_t* ctx, char end) {
    while (ctx->offset < ctx->source.length) {
        // 处理转义字符 \r \n \t \\ \" \' \0 \xFF
        if (is_next(ctx, '\\')) {
            // 这里只要确保读到正确的字符串结尾，不需要判断转义字符是否合法
            ctx->offset++;
        } else if (is_next(ctx, end)) {
            break;
        } else {
            ctx->offset++;
        }
    }
}